

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

FiniteAutomaton *
Omega_h::make_char_set_nfa
          (FiniteAutomaton *__return_storage_ptr__,
          set<char,_std::less<char>,_std::allocator<char>_> *accepted,int token)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  set<int,_std::less<int>,_std::allocator<int>_> symbol_set;
  int local_64;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = (accepted->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(accepted->_M_t)._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_64 = GetSymbol<char,_true>::eval((char)p_Var1[1]._M_color);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_60,&local_64);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  FiniteAutomaton::make_set_nfa
            (__return_storage_ptr__,0x62,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_60
             ,token);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton make_char_set_nfa(std::set<char> const& accepted, int token) {
  std::set<int> symbol_set;
  for (auto c : accepted) symbol_set.insert(get_symbol(c));
  return FiniteAutomaton::make_set_nfa(Omega_h::NCHARS, symbol_set, token);
}